

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void httplib::detail::parse_query_text(string *s,Params *params)

{
  char *b;
  long lVar1;
  long lVar2;
  Params *params_local;
  string *s_local;
  
  b = (char *)std::__cxx11::string::data();
  lVar1 = std::__cxx11::string::data();
  lVar2 = std::__cxx11::string::size();
  split<httplib::detail::parse_query_text(std::__cxx11::string_const&,std::multimap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(char_const*,char_const*)_1_>
            (b,(char *)(lVar1 + lVar2),'&',(anon_class_8_1_65ceeac4)params);
  return;
}

Assistant:

inline void parse_query_text(const std::string &s, Params &params) {
			split(s.data(), s.data() + s.size(), '&', [&](const char *b, const char *e) {
				std::string key;
				std::string val;
				split(b, e, '=', [&](const char *b2, const char *e2) {
					if (key.empty()) {
						key.assign(b2, e2);
					} else {
						val.assign(b2, e2);
					}
				});

				if (!key.empty()) {
					params.emplace(decode_url(key, true), decode_url(val, true));
				}
			});
		}